

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::ParenthesisOperator> *op)

{
  element_type *peVar1;
  pointer psVar2;
  VariableName unaff_EBP;
  int variableNo;
  _Optional_payload_base<int> result;
  const_iterator __begin4;
  pointer op_00;
  
  peVar1 = (op->super___shared_ptr<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  op_00 = (peVar1->operators).
          super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->operators).
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (op_00 == psVar2) {
    AppendVariableDeclarationBegin(this);
    std::operator<<(this->os,'0');
    AppendVariableDeclarationEnd(this);
    result._M_payload = (_Storage<int,_true>)0x0;
    result._M_engaged = false;
    result._5_3_ = 0;
  }
  else {
    for (; op_00 != psVar2; op_00 = op_00 + 1) {
      unaff_EBP.no = ProcessOperator(this,op_00);
    }
    if (-1 < unaff_EBP.no) {
      AppendVariableDeclarationBegin(this);
      operator<<(this->os,unaff_EBP);
      AppendVariableDeclarationEnd(this);
    }
    result = (_Optional_payload_base<int>)((ulong)(uint)unaff_EBP.no | 0x100000000);
  }
  Return(this,(optional<int>)result);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ParenthesisOperator>& op) override
    {
        if (op->GetOperators().empty())
        {
            AppendVariableDeclarationBegin();
            os << '0';
            AppendVariableDeclarationEnd();
            Return();
        }
        else
        {
            int variableNo;

            for (auto& item : op->GetOperators())
            {
                variableNo = ProcessOperator(item);
            }

            if (variableNo >= 0)
            {
                AppendVariableDeclarationBegin();
                os << VariableName(variableNo);
                AppendVariableDeclarationEnd();
            }

            Return(variableNo);
        }
    }